

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prime.cpp
# Opt level: O1

int is_prime(int x)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  double __x;
  double dVar4;
  
  uVar3 = 0xffffffff;
  if (((1 < x) && (uVar3 = 1, 3 < x)) && (uVar3 = 0, (x & 1U) != 0)) {
    __x = (double)x;
    if (__x < 0.0) {
      dVar4 = sqrt(__x);
    }
    else {
      dVar4 = SQRT(__x);
    }
    dVar4 = floor(dVar4);
    bVar1 = dVar4 < 3.0;
    if ((!bVar1) && ((uint)x % 3 != 0)) {
      uVar3 = 5;
      do {
        dVar4 = SQRT(__x);
        if (__x < 0.0) {
          dVar4 = sqrt(__x);
        }
        dVar4 = floor(dVar4);
        bVar1 = dVar4 < (double)(int)uVar3;
      } while ((!bVar1) && (uVar2 = (uint)x % uVar3, uVar3 = uVar3 + 2, uVar2 != 0));
    }
    uVar3 = (uint)bVar1;
  }
  return uVar3;
}

Assistant:

int is_prime(const int x) {
    if (x < 2) {
        return -1;
    }

    if (x < 4) {
        return 1;
    }

    if (x % 2 == 0) {
        return 0;
    }

    for (int i = 3; i <= floor(sqrt((double) x)); i += 2) {
        if ((x % i) == 0) {
            return 0;
        }
    }

    return 1;
}